

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# module.cpp
# Opt level: O2

Function * __thiscall LLVMBC::Module::getFunction(Module *this,String *name)

{
  bool bVar1;
  Function *pFVar2;
  long lVar3;
  __normal_iterator<LLVMBC::Function_*const_*,_std::vector<LLVMBC::Function_*,_dxil_spv::ThreadLocalAllocator<LLVMBC::Function_*>_>_>
  _Var4;
  long lVar5;
  __normal_iterator<LLVMBC::Function_*const_*,_std::vector<LLVMBC::Function_*,_dxil_spv::ThreadLocalAllocator<LLVMBC::Function_*>_>_>
  __it;
  String *local_40;
  Function **local_38;
  
  __it._M_current =
       (this->functions).
       super__Vector_base<LLVMBC::Function_*,_dxil_spv::ThreadLocalAllocator<LLVMBC::Function_*>_>.
       _M_impl.super__Vector_impl_data._M_start;
  local_38 = (this->functions).
             super__Vector_base<LLVMBC::Function_*,_dxil_spv::ThreadLocalAllocator<LLVMBC::Function_*>_>
             ._M_impl.super__Vector_impl_data._M_finish;
  lVar5 = (long)local_38 - (long)__it._M_current;
  local_40 = name;
  for (lVar3 = lVar5 >> 5; _Var4._M_current = __it._M_current, 0 < lVar3; lVar3 = lVar3 + -1) {
    bVar1 = __gnu_cxx::__ops::
            _Iter_pred<LLVMBC::Module::getFunction(std::__cxx11::basic_string<char,std::char_traits<char>,dxil_spv::ThreadLocalAllocator<char>>const&)const::$_0>
            ::operator()((_Iter_pred<LLVMBC::Module::getFunction(std::__cxx11::basic_string<char,std::char_traits<char>,dxil_spv::ThreadLocalAllocator<char>>const&)const::__0>
                          *)&local_40,__it);
    if (bVar1) goto LAB_00175da0;
    bVar1 = __gnu_cxx::__ops::
            _Iter_pred<LLVMBC::Module::getFunction(std::__cxx11::basic_string<char,std::char_traits<char>,dxil_spv::ThreadLocalAllocator<char>>const&)const::$_0>
            ::operator()((_Iter_pred<LLVMBC::Module::getFunction(std::__cxx11::basic_string<char,std::char_traits<char>,dxil_spv::ThreadLocalAllocator<char>>const&)const::__0>
                          *)&local_40,
                         (__normal_iterator<LLVMBC::Function_*const_*,_std::vector<LLVMBC::Function_*,_dxil_spv::ThreadLocalAllocator<LLVMBC::Function_*>_>_>
                          )(__it._M_current + 1));
    _Var4._M_current = __it._M_current + 1;
    if (bVar1) goto LAB_00175da0;
    bVar1 = __gnu_cxx::__ops::
            _Iter_pred<LLVMBC::Module::getFunction(std::__cxx11::basic_string<char,std::char_traits<char>,dxil_spv::ThreadLocalAllocator<char>>const&)const::$_0>
            ::operator()((_Iter_pred<LLVMBC::Module::getFunction(std::__cxx11::basic_string<char,std::char_traits<char>,dxil_spv::ThreadLocalAllocator<char>>const&)const::__0>
                          *)&local_40,
                         (__normal_iterator<LLVMBC::Function_*const_*,_std::vector<LLVMBC::Function_*,_dxil_spv::ThreadLocalAllocator<LLVMBC::Function_*>_>_>
                          )(__it._M_current + 2));
    _Var4._M_current = __it._M_current + 2;
    if (bVar1) goto LAB_00175da0;
    bVar1 = __gnu_cxx::__ops::
            _Iter_pred<LLVMBC::Module::getFunction(std::__cxx11::basic_string<char,std::char_traits<char>,dxil_spv::ThreadLocalAllocator<char>>const&)const::$_0>
            ::operator()((_Iter_pred<LLVMBC::Module::getFunction(std::__cxx11::basic_string<char,std::char_traits<char>,dxil_spv::ThreadLocalAllocator<char>>const&)const::__0>
                          *)&local_40,
                         (__normal_iterator<LLVMBC::Function_*const_*,_std::vector<LLVMBC::Function_*,_dxil_spv::ThreadLocalAllocator<LLVMBC::Function_*>_>_>
                          )(__it._M_current + 3));
    _Var4._M_current = __it._M_current + 3;
    if (bVar1) goto LAB_00175da0;
    __it._M_current = __it._M_current + 4;
    lVar5 = lVar5 + -0x20;
  }
  lVar5 = lVar5 >> 3;
  if (lVar5 != 1) {
    if (lVar5 != 2) {
      _Var4._M_current = local_38;
      if ((lVar5 != 3) ||
         (bVar1 = __gnu_cxx::__ops::
                  _Iter_pred<LLVMBC::Module::getFunction(std::__cxx11::basic_string<char,std::char_traits<char>,dxil_spv::ThreadLocalAllocator<char>>const&)const::$_0>
                  ::operator()((_Iter_pred<LLVMBC::Module::getFunction(std::__cxx11::basic_string<char,std::char_traits<char>,dxil_spv::ThreadLocalAllocator<char>>const&)const::__0>
                                *)&local_40,__it), _Var4._M_current = __it._M_current, bVar1))
      goto LAB_00175da0;
      _Var4._M_current = __it._M_current + 1;
    }
    bVar1 = __gnu_cxx::__ops::
            _Iter_pred<LLVMBC::Module::getFunction(std::__cxx11::basic_string<char,std::char_traits<char>,dxil_spv::ThreadLocalAllocator<char>>const&)const::$_0>
            ::operator()((_Iter_pred<LLVMBC::Module::getFunction(std::__cxx11::basic_string<char,std::char_traits<char>,dxil_spv::ThreadLocalAllocator<char>>const&)const::__0>
                          *)&local_40,_Var4);
    if (bVar1) goto LAB_00175da0;
    __it._M_current = _Var4._M_current + 1;
  }
  bVar1 = __gnu_cxx::__ops::
          _Iter_pred<LLVMBC::Module::getFunction(std::__cxx11::basic_string<char,std::char_traits<char>,dxil_spv::ThreadLocalAllocator<char>>const&)const::$_0>
          ::operator()((_Iter_pred<LLVMBC::Module::getFunction(std::__cxx11::basic_string<char,std::char_traits<char>,dxil_spv::ThreadLocalAllocator<char>>const&)const::__0>
                        *)&local_40,__it);
  _Var4._M_current = local_38;
  if (bVar1) {
    _Var4._M_current = __it._M_current;
  }
LAB_00175da0:
  if (_Var4._M_current ==
      (this->functions).
      super__Vector_base<LLVMBC::Function_*,_dxil_spv::ThreadLocalAllocator<LLVMBC::Function_*>_>.
      _M_impl.super__Vector_impl_data._M_finish) {
    pFVar2 = (Function *)0x0;
  }
  else {
    pFVar2 = *_Var4._M_current;
  }
  return pFVar2;
}

Assistant:

Function *Module::getFunction(const String &name) const
{
	auto itr =
	    std::find_if(functions.begin(), functions.end(), [&](const Function *func) { return func->getName() == name; });

	if (itr != functions.end())
		return *itr;
	else
		return nullptr;
}